

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O3

Ray * __thiscall Camera::GetRay(Ray *__return_storage_ptr__,Camera *this,float s,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Vec3 _origin;
  Vec3 _offset;
  Vec3 local_90;
  Vec3 local_84;
  Vec3 local_78;
  double local_68;
  Vec3 local_5c;
  Vec3 local_50;
  Vec3 local_44;
  Vec3 local_38;
  Vec3 local_2c;
  
  fVar1 = this->m_lens_radius;
  fVar3 = 0.0;
  if (fVar1 <= 0.0) {
    local_78.e[0] = 0.0;
    local_78.e[1] = 0.0;
    local_78.e[2] = 0.0;
  }
  else {
    random_in_unit_disk();
    operator*(fVar1,&local_78);
    fVar3 = local_78.e[0];
  }
  operator*(&local_90,fVar3);
  operator*(&local_84,local_78.e[1]);
  operator+(&local_90,&local_84);
  operator+(&this->m_origin,&local_5c);
  fVar1 = this->m_time_open;
  local_68 = drand48();
  fVar3 = this->m_time_open;
  fVar2 = this->m_time_close;
  operator*(s,&local_44);
  operator+(&this->m_lower_left_corner,&local_44);
  operator*(t,&local_50);
  operator+(&local_38,&local_50);
  operator-(&local_2c,&local_90);
  (__return_storage_ptr__->m_origin).e[0] = local_90.e[0];
  (__return_storage_ptr__->m_origin).e[1] = local_90.e[1];
  (__return_storage_ptr__->m_origin).e[2] = local_90.e[2];
  (__return_storage_ptr__->m_direction).e[0] = local_84.e[0];
  *(undefined8 *)((__return_storage_ptr__->m_direction).e + 1) = local_84.e._4_8_;
  __return_storage_ptr__->m_time = (fVar2 - fVar3) * (float)local_68 + fVar1;
  return __return_storage_ptr__;
}

Assistant:

Ray
Camera::GetRay(float s, float t) const
{ 
    Vec3  _rd     = (m_lens_radius > 0.0f) ? m_lens_radius * random_in_unit_disk() : Vec3(0.0f, 0.0f, 0.0f);
    Vec3  _offset = m_u * _rd.x() + m_v * _rd.y();
    Vec3  _origin = m_origin + _offset;
    float _time   = m_time_open + RANDOM_GEN()*(m_time_close - m_time_open);

    return Ray(_origin, m_lower_left_corner + s*m_horizontal + t*m_vertical - _origin, _time);
}